

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O2

void __thiscall
kj::Table<kj::StringPtr,_kj::TreeIndex<kj::_::(anonymous_namespace)::StringCompare>_>::eraseImpl
          (Table<kj::StringPtr,_kj::TreeIndex<kj::_::(anonymous_namespace)::StringCompare>_> *this,
          size_t pos)

{
  size_t oldPos;
  undefined8 *puVar1;
  undefined8 *puVar2;
  StringPtr *pSVar3;
  undefined8 uVar4;
  long lVar5;
  HashIndex<kj::_::(anonymous_namespace)::StringHasher> *indexObj;
  ArrayPtr<kj::StringPtr> table;
  ArrayPtr<kj::StringPtr> table_00;
  StringPtr local_38;
  
  pSVar3 = *(StringPtr **)this;
  table.size_ = *(long *)(this + 8) - (long)pSVar3 >> 4;
  local_38.content.ptr = pSVar3[pos].content.ptr;
  local_38.content.size_ = pSVar3[pos].content.size_;
  table.ptr = pSVar3;
  TreeIndex<kj::_::(anonymous_namespace)::StringCompare>::erase<kj::StringPtr,kj::StringPtr>
            ((TreeIndex<kj::_::(anonymous_namespace)::StringCompare> *)(this + 0x20),table,pos,
             &local_38);
  pSVar3 = *(StringPtr **)this;
  lVar5 = *(long *)(this + 8);
  table_00.size_ = lVar5 - (long)pSVar3 >> 4;
  oldPos = table_00.size_ - 1;
  if (oldPos != pos) {
    local_38.content.ptr = pSVar3[oldPos].content.ptr;
    local_38.content.size_ = pSVar3[oldPos].content.size_;
    table_00.ptr = pSVar3;
    TreeIndex<kj::_::(anonymous_namespace)::StringCompare>::move<kj::StringPtr,kj::StringPtr>
              ((TreeIndex<kj::_::(anonymous_namespace)::StringCompare> *)(this + 0x20),table_00,
               oldPos,pos,&local_38);
    puVar1 = (undefined8 *)(*(long *)this + oldPos * 0x10);
    uVar4 = puVar1[1];
    puVar2 = (undefined8 *)(*(long *)this + pos * 0x10);
    *puVar2 = *puVar1;
    puVar2[1] = uVar4;
    lVar5 = *(long *)(this + 8);
  }
  *(long *)(this + 8) = lVar5 + -0x10;
  return;
}

Assistant:

void Table<Row, Indexes...>::eraseImpl(size_t pos) {
  Impl<>::erase(*this, pos, rows[pos]);
  size_t back = rows.size() - 1;
  if (pos != back) {
    Impl<>::move(*this, back, pos, rows[back]);
    rows[pos] = kj::mv(rows[back]);
  }
  rows.removeLast();
}